

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_common.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::Add
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this,
          FieldDescriptor *field,
          unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
          *field_generator)

{
  _Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false> local_10 [2];
  
  if (field->containing_type_ == this->descriptor_) {
    local_10[0]._M_head_impl =
         (field_generator->_M_t).
         super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
         .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
         _M_head_impl;
    (field_generator->_M_t).
    super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
    _M_head_impl = (ImmutableFieldGenerator *)0x0;
    std::
    vector<google::protobuf::compiler::java::ImmutableFieldGenerator_const*,std::allocator<google::protobuf::compiler::java::ImmutableFieldGenerator_const*>>
    ::emplace_back<google::protobuf::compiler::java::ImmutableFieldGenerator_const*>
              ((vector<google::protobuf::compiler::java::ImmutableFieldGenerator_const*,std::allocator<google::protobuf::compiler::java::ImmutableFieldGenerator_const*>>
                *)&this->field_generators_,&local_10[0]._M_head_impl);
    return;
  }
  Add();
}

Assistant:

void Add(const FieldDescriptor* field,
           std::unique_ptr<FieldGeneratorType> field_generator) {
    ABSL_CHECK_EQ(field->containing_type(), descriptor_);
    field_generators_.push_back(field_generator.release());
  }